

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall
Node::OutputVarName_abi_cxx11_(string *__return_storage_ptr__,Node *this,Node *array,int InDefine)

{
  VariableStruct *this_00;
  string sStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = VariableList::Lookup(Variables,&this->TextValue,array,0);
  if (this_00 == (VariableStruct *)0x0) {
    genname(&sStack_88,&this->TextValue);
  }
  else {
    VariableStruct::GetName_abi_cxx11_(&sStack_88,this_00,InDefine & 1);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  if ((char)((InDefine & 2U) >> 1) == '\0' && array != (Node *)0x0) {
    if ((this_00 == (VariableStruct *)0x0) || (this_00->Class != VARCLASS_FUNC)) {
      for (; array != (Node *)0x0; array = array->Block[0]) {
        OutputArrayParam_abi_cxx11_(&local_68,array,InDefine);
        std::operator+(&local_48,"[",&local_68);
        std::operator+(&sStack_88,&local_48,"]");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&sStack_88);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    else {
      NoParen_abi_cxx11_(&local_68,array);
      std::operator+(&local_48,"(",&local_68);
      std::operator+(&sStack_88,&local_48,")");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_88);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputVarName(
	Node* array,		/**< Pointer to any array references */
	int InDefine		/**< Is this part of a definition,
       					bit 1 = Yes, bit2 = Don't add array dims*/
)
{
	int flags = 0;		// GetName flags

	if (InDefine & 1)
	{
		//
		// We don't want the prefix on the definition, since the
		// class name is already handled by the 'class' definition.
		//
		flags |= 1;
	}

	//
	// Local Variables
	//
	VariableStruct *ThisVar;
	std::string result;

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(TextValue, array);

	//
	// Make up a good name to print for this variable
	//
	if (ThisVar != 0)
	{
		result = ThisVar->GetName(flags);
	}
	else
	{
		result = genname(TextValue);
	}

	//
	// Handle array references (May need to be modified from x[a,b]
	// to x[a][b] manually.
	//
	if (array != 0 && (InDefine & 2) == 0)
	{
		if ((ThisVar != 0) && (ThisVar->Class == VARCLASS_FUNC))
		{
			result += "(" + array->NoParen() + ")";
		}
		else
		{
			while(array != 0)
			{
				result += "[" + array->OutputArrayParam(InDefine) + "]";
				array = array->Block[0];
			}
		}
	}

	return result;
}